

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O3

void GraphTask::add_edge_features_single_fn(task_data *D,float fv,uint64_t fx)

{
  long lVar1;
  
  lVar1 = (long)*D->neighbor_predictions;
  features::push_back((D->cur_node->super_example_predict).feature_space + 0x83,fv,
                      (ulong)((int)D->multiplier *
                              (((uint)lVar1 |
                               (uint)(long)(*D->neighbor_predictions - 9.223372e+18) &
                               (uint)(lVar1 >> 0x3f)) * 0x14cc1503 + (int)(fx / D->multiplier)) &
                             (uint)D->mask));
  return;
}

Assistant:

void add_edge_features_single_fn(task_data& D, float fv, uint64_t fx)
{
  example* node = D.cur_node;
  features& fs = node->feature_space[neighbor_namespace];
  uint64_t fx2 = fx / (uint64_t)D.multiplier;
  size_t k = (size_t)D.neighbor_predictions[0];
  fs.push_back(fv, (uint32_t)((fx2 + 348919043 * k) * D.multiplier) & (uint64_t)D.mask);
}